

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
DyndepParserTestExplicitOut::DyndepParserTestExplicitOut(DyndepParserTestExplicitOut *this)

{
  DyndepParserTestExplicitOut *this_local;
  
  DyndepParserTest::DyndepParserTest(&this->super_DyndepParserTest);
  (this->super_DyndepParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DyndepParserTestExplicitOut_00262ac8;
  return;
}

Assistant:

TEST_F(DyndepParserTest, ExplicitOut) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out exp: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: explicit outputs not supported\n"
            "build out exp: dyndep\n"
            "             ^ near here", err);
}